

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_new_path_list_predicate(lyd_node *list,char *list_name,char *predicate,int *parsed)

{
  lys_node *node;
  lys_node *node_00;
  int iVar1;
  ushort **ppuVar2;
  lys_module *plVar3;
  lys_module *plVar4;
  lyd_node *plVar5;
  lys_node *key;
  lys_node_list *slist;
  int has_predicate;
  int val_len;
  int nam_len;
  int mod_name_len;
  int i;
  int r;
  char *key_val;
  char *value;
  char *name;
  char *mod_name;
  int *parsed_local;
  char *predicate_local;
  char *list_name_local;
  lyd_node *list_local;
  
  node = list->schema;
  mod_name = (char *)parsed;
  parsed_local = (int *)predicate;
  predicate_local = list_name;
  list_name_local = (char *)list;
  mod_name_len = parse_schema_json_predicate
                           (predicate,&name,&val_len,&value,&has_predicate,&key_val,
                            (int *)((long)&slist + 4),(int *)&slist);
  if ((mod_name_len < 1) || (iVar1 = strncmp(value,".",(long)has_predicate), iVar1 == 0)) {
    ly_vlog(node->module->ctx,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
            (ulong)(uint)(int)*(char *)((long)parsed_local + (long)-mod_name_len),
            (long)parsed_local + (long)-mod_name_len);
    list_local._4_4_ = -1;
  }
  else {
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)*value] & 0x800) == 0) {
      if (node->padding[2] == '\0') {
        list_local._4_4_ = 0;
      }
      else {
        nam_len = 0;
        do {
          node_00 = *(lys_node **)(*(long *)&node[1].flags + (long)nam_len * 8);
          *(int *)mod_name = mod_name_len + *(int *)mod_name;
          parsed_local = (int *)((long)parsed_local + (long)mod_name_len);
          if (key_val == (char *)0x0) {
LAB_0019ccb9:
            ly_vlog(node->module->ctx,LYE_PATH_INKEY,LY_VLOG_NONE,(void *)0x0,value);
            return -1;
          }
          if (name == (char *)0x0) {
            plVar3 = lys_node_module(node_00);
            plVar4 = lys_node_module(node);
            if (plVar3 != plVar4) goto LAB_0019ccb9;
          }
          if (name != (char *)0x0) {
            plVar3 = lys_node_module(node_00);
            iVar1 = strncmp(plVar3->name,name,(long)val_len);
            if ((iVar1 != 0) || (plVar3 = lys_node_module(node_00), plVar3->name[val_len] != '\0'))
            goto LAB_0019ccb9;
          }
          iVar1 = strncmp(node_00->name,value,(long)has_predicate);
          if ((iVar1 != 0) || (node_00->name[has_predicate] != '\0')) goto LAB_0019ccb9;
          _i = (char *)malloc((long)(slist._4_4_ + 1));
          if (_i == (char *)0x0) {
            ly_log(node->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lyd_new_path_list_predicate");
            return -1;
          }
          strncpy(_i,key_val,(long)slist._4_4_);
          _i[slist._4_4_] = '\0';
          plVar5 = _lyd_new_leaf((lyd_node *)list_name_local,node_00,_i,0,0);
          if (plVar5 == (lyd_node *)0x0) {
            free(_i);
            return -1;
          }
          free(_i);
          nam_len = nam_len + 1;
          if ((int)(uint)node->padding[2] <= nam_len) {
            return 0;
          }
          if ((int)slist == 0) {
            ly_vlog(node->module->ctx,LYE_PATH_MISSKEY,LY_VLOG_NONE,(void *)0x0,predicate_local);
            return -1;
          }
          mod_name_len = parse_schema_json_predicate
                                   ((char *)parsed_local,&name,&val_len,&value,&has_predicate,
                                    &key_val,(int *)((long)&slist + 4),(int *)&slist);
        } while ((0 < mod_name_len) && (iVar1 = strncmp(value,".",(long)has_predicate), iVar1 != 0))
        ;
        ly_vlog(node->module->ctx,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                (ulong)(uint)(int)*(char *)((long)parsed_local + (long)-mod_name_len),
                (long)parsed_local + (long)-mod_name_len);
        list_local._4_4_ = -1;
      }
    }
    else {
      *(int *)mod_name = mod_name_len + *(int *)mod_name;
      list_local._4_4_ = 0;
    }
  }
  return list_local._4_4_;
}

Assistant:

static int
lyd_new_path_list_predicate(struct lyd_node *list, const char *list_name, const char *predicate, int *parsed)
{
    const char *mod_name, *name, *value;
    char *key_val;
    int r, i, mod_name_len, nam_len, val_len, has_predicate;
    struct lys_node_list *slist;
    struct lys_node *key;

    slist = (struct lys_node_list *)list->schema;

    /* is the predicate a number? */
    if (((r = parse_schema_json_predicate(predicate, &mod_name, &mod_name_len, &name, &nam_len, &value, &val_len, &has_predicate)) < 1)
            || !strncmp(name, ".", nam_len)) {
        LOGVAL(slist->module->ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, predicate[-r], &predicate[-r]);
        return -1;
    }

    if (isdigit(name[0])) {
        /* position index - creating without keys */
        *parsed += r;
        return 0;
    }

    /* it's not a number, so there must be some keys */
    if (!slist->keys_size) {
        /* there are none, so pretend we did not parse anything to get invalid char error later */
        return 0;
    }

    /* go through all the keys */
    i = 0;
    goto check_parsed_values;

    for (; i < slist->keys_size; ++i) {
        if (!has_predicate) {
            LOGVAL(slist->module->ctx, LYE_PATH_MISSKEY, LY_VLOG_NONE, NULL, list_name);
            return -1;
        }

        if (((r = parse_schema_json_predicate(predicate, &mod_name, &mod_name_len, &name, &nam_len, &value, &val_len, &has_predicate)) < 1)
                || !strncmp(name, ".", nam_len)) {
            LOGVAL(slist->module->ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, predicate[-r], &predicate[-r]);
            return -1;
        }

check_parsed_values:
        key = (struct lys_node *)slist->keys[i];
        *parsed += r;
        predicate += r;

        if (!value || (!mod_name && (lys_node_module(key) != lys_node_module((struct lys_node *)slist)))
                || (mod_name && (strncmp(lys_node_module(key)->name, mod_name, mod_name_len) || lys_node_module(key)->name[mod_name_len]))
                || strncmp(key->name, name, nam_len) || key->name[nam_len]) {
            LOGVAL(slist->module->ctx, LYE_PATH_INKEY, LY_VLOG_NONE, NULL, name);
            return -1;
        }

        key_val = malloc((val_len + 1) * sizeof(char));
        LY_CHECK_ERR_RETURN(!key_val, LOGMEM(slist->module->ctx), -1);
        strncpy(key_val, value, val_len);
        key_val[val_len] = '\0';

        if (!_lyd_new_leaf(list, key, key_val, 0, 0)) {
            free(key_val);
            return -1;
        }
        free(key_val);
    }

    return 0;
}